

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReach.c
# Opt level: O3

void Abc_NtkVerifyUsingBdds
               (Abc_Ntk_t *pNtk,int nBddMax,int nIterMax,int fPartition,int fReorder,int fVerbose)

{
  long *plVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  DdManager *dd;
  void *__ptr;
  undefined8 uVar6;
  DdNode **pbParts;
  DdNode *n;
  DdNode *n_00;
  int fVerbose_00;
  long lVar7;
  long lVar8;
  int iVar9;
  DdNode *n_01;
  int iVar10;
  timespec ts;
  int in_stack_ffffffffffffff88;
  timespec local_48;
  long local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10d,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10e,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  if (*(int *)((long)*pNtk->vPos->pArray + 0x2c) != 0) {
    __assert_fail("Abc_ObjFanoutNum(Abc_NtkPo(pNtk,0)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10f,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,nBddMax,1,fReorder,fVerbose);
  if (dd == (DdManager *)0x0) {
    printf("The number of intermediate BDD nodes exceeded the limit (%d).\n",(ulong)(uint)nBddMax);
    return;
  }
  if (fVerbose != 0) {
    uVar4 = Cudd_ReadKeys(dd);
    uVar5 = Cudd_ReadDead(dd);
    printf("Shared BDD size is %6d nodes.\n",(ulong)(uVar4 - uVar5));
  }
  if (pNtk->vPos->nSize < 1) {
LAB_00290d99:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  plVar1 = (long *)*pNtk->vPos->pArray;
  lVar8 = *(long *)(*plVar1 + 0x1b0);
  if (*(int *)(lVar8 + 4) < 8) goto LAB_00290d99;
  piVar2 = *(int **)(*(long *)(lVar8 + 8) + 0x38);
  __ptr = *(void **)(piVar2 + 2);
  if (__ptr == (void *)0x0) {
    __assert_fail("p->pArrayPtr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecAtt.h"
                  ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
  }
  iVar3 = (int)plVar1[2];
  lVar8 = (long)iVar3;
  iVar10 = *piVar2;
  if (iVar10 <= iVar3) {
    iVar9 = iVar3 + 10;
    if (iVar3 < iVar10 * 2) {
      iVar9 = iVar10 * 2;
    }
    if (iVar10 < iVar9) {
      local_38 = (long)iVar9;
      __ptr = realloc(__ptr,local_38 * 8);
      *(void **)(piVar2 + 2) = __ptr;
      memset((void *)((long)__ptr + (long)*piVar2 * 8),0,(local_38 - *piVar2) * 8);
      *piVar2 = iVar9;
    }
  }
  n_01 = *(DdNode **)((long)__ptr + lVar8 * 8);
  if (n_01 == (DdNode *)0x0) {
    if (*(code **)(piVar2 + 8) == (code *)0x0) {
      n_01 = (DdNode *)0x0;
    }
    else {
      uVar6 = (**(code **)(piVar2 + 8))(*(undefined8 *)(piVar2 + 4));
      *(undefined8 *)(*(long *)(piVar2 + 2) + lVar8 * 8) = uVar6;
      n_01 = *(DdNode **)(*(long *)(piVar2 + 2) + lVar8 * 8);
    }
  }
  Cudd_Ref(n_01);
  pbParts = Abc_NtkCreatePartitions(dd,pNtk,fReorder,fVerbose);
  n = Abc_NtkInitStateVarMap(dd,pNtk,fVerbose_00);
  Cudd_Ref(n);
  iVar3 = Cudd_bddLeq(dd,n,(DdNode *)((ulong)n_01 ^ 1));
  if (iVar3 == 0) {
    printf("The miter is proved REACHABLE in the initial state.  ");
  }
  else {
    n_00 = Abc_NtkComputeReachable
                     (dd,pNtk,pbParts,n,n_01,nBddMax,nIterMax,fPartition,in_stack_ffffffffffffff88,
                      fVerbose);
    if (n_00 != (DdNode *)0x0) {
      Cudd_Ref(n_00);
      Cudd_RecursiveDeref(dd,n_00);
    }
  }
  Cudd_RecursiveDeref(dd,n_01);
  Cudd_RecursiveDeref(dd,n);
  if (pNtk->nObjCounts[8] < 1) {
    if (pbParts == (DdNode **)0x0) goto LAB_00290cfb;
  }
  else {
    lVar8 = 0;
    do {
      Cudd_RecursiveDeref(dd,pbParts[lVar8]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < pNtk->nObjCounts[8]);
  }
  free(pbParts);
LAB_00290cfb:
  Extra_StopManager(dd);
  Abc_Print((int)dd,"%s =","Time");
  iVar10 = 3;
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar8 = -1;
  }
  else {
    lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(iVar10,"%9.2f sec\n",(double)(lVar8 + lVar7) / 1000000.0);
  fflush(_stdout);
}

Assistant:

void Abc_NtkVerifyUsingBdds( Abc_Ntk_t * pNtk, int nBddMax, int nIterMax, int fPartition, int fReorder, int fVerbose )
{
    DdManager * dd;
    DdNode ** pbParts;
    DdNode * bOutput, * bReached, * bInitial;
    int i;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( Abc_ObjFanoutNum(Abc_NtkPo(pNtk,0)) == 0 ); // PO should go first

    // compute the global BDDs of the latches
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, nBddMax, 1, fReorder, fVerbose );    
    if ( dd == NULL )
    {
        printf( "The number of intermediate BDD nodes exceeded the limit (%d).\n", nBddMax );
        return;
    }
    if ( fVerbose )
        printf( "Shared BDD size is %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // save the output BDD
    bOutput = (DdNode *)Abc_ObjGlobalBdd(Abc_NtkPo(pNtk,0)); Cudd_Ref( bOutput );

    // create partitions
    pbParts = Abc_NtkCreatePartitions( dd, pNtk, fReorder, fVerbose );

    // create the initial state and the variable map
    bInitial  = Abc_NtkInitStateVarMap( dd, pNtk, fVerbose );  Cudd_Ref( bInitial );

    // check the result
    if ( !Cudd_bddLeq( dd, bInitial, Cudd_Not(bOutput) ) )
        printf( "The miter is proved REACHABLE in the initial state.  " );
    else
    {
        // compute the reachable states
        bReached = Abc_NtkComputeReachable( dd, pNtk, pbParts, bInitial, bOutput, nBddMax, nIterMax, fPartition, fReorder, fVerbose ); 
        if ( bReached != NULL )
        {
            Cudd_Ref( bReached );
            Cudd_RecursiveDeref( dd, bReached );
        }
    }

    // cleanup
    Cudd_RecursiveDeref( dd, bOutput );
    Cudd_RecursiveDeref( dd, bInitial );
    for ( i = 0; i < Abc_NtkLatchNum(pNtk); i++ )
        Cudd_RecursiveDeref( dd, pbParts[i] );
    ABC_FREE( pbParts );
    Extra_StopManager( dd );

    // report the runtime
    ABC_PRT( "Time", Abc_Clock() - clk );
    fflush( stdout );
}